

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_file_system.cpp
# Opt level: O3

vector<duckdb::OpenFileInfo,_true> * __thiscall
duckdb::LocalFileSystem::FetchFileWithoutGlob
          (vector<duckdb::OpenFileInfo,_true> *__return_storage_ptr__,LocalFileSystem *this,
          string *path,FileOpener *opener,bool absolute_path)

{
  int iVar1;
  pointer a;
  string search_paths_str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  search_paths;
  string joined_path;
  Value value;
  string local_e8;
  string *local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_c0;
  LogicalType local_a8;
  string local_90;
  Value local_70;
  
  (__return_storage_ptr__->super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>
  ).super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>
  ).super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>
  ).super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = (*(this->super_FileSystem)._vptr_FileSystem[0x12])(this,path,opener);
  if (((char)iVar1 == '\0') &&
     (iVar1 = (*(this->super_FileSystem)._vptr_FileSystem[0x13])(this,path,opener),
     (char)iVar1 == '\0')) {
    if (absolute_path) {
      return __return_storage_ptr__;
    }
    LogicalType::LogicalType(&local_a8,SQLNULL);
    Value::Value(&local_70,&local_a8);
    LogicalType::~LogicalType(&local_a8);
    if (opener != (FileOpener *)0x0) {
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"file_search_path","");
      iVar1 = (*opener->_vptr_FileOpener[3])(opener,&local_e8,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      if ((char)iVar1 != '\x03') {
        Value::ToString_abi_cxx11_(&local_e8,&local_70);
        StringUtil::Split(&local_c0,&local_e8,',');
        local_c8 = local_c0.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        if (local_c0.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_c0.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          a = local_c0.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
          do {
            FileSystem::JoinPath(&local_90,&this->super_FileSystem,a,path);
            iVar1 = (*(this->super_FileSystem)._vptr_FileSystem[0x12])(this,&local_90,opener);
            if (((char)iVar1 != '\0') ||
               (iVar1 = (*(this->super_FileSystem)._vptr_FileSystem[0x13])(this,&local_90,opener),
               (char)iVar1 != '\0')) {
              ::std::vector<duckdb::OpenFileInfo,std::allocator<duckdb::OpenFileInfo>>::
              emplace_back<std::__cxx11::string&>
                        ((vector<duckdb::OpenFileInfo,std::allocator<duckdb::OpenFileInfo>> *)
                         __return_storage_ptr__,&local_90);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) {
              operator_delete(local_90._M_dataplus._M_p);
            }
            a = a + 1;
          } while (a != local_c8);
        }
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p);
        }
      }
    }
    Value::~Value(&local_70);
    return __return_storage_ptr__;
  }
  ::std::vector<duckdb::OpenFileInfo,std::allocator<duckdb::OpenFileInfo>>::
  emplace_back<std::__cxx11::string_const&>
            ((vector<duckdb::OpenFileInfo,std::allocator<duckdb::OpenFileInfo>> *)
             __return_storage_ptr__,path);
  return __return_storage_ptr__;
}

Assistant:

vector<OpenFileInfo> LocalFileSystem::FetchFileWithoutGlob(const string &path, FileOpener *opener, bool absolute_path) {
	vector<OpenFileInfo> result;
	if (FileExists(path, opener) || IsPipe(path, opener)) {
		result.emplace_back(path);
	} else if (!absolute_path) {
		Value value;
		if (opener && opener->TryGetCurrentSetting("file_search_path", value)) {
			auto search_paths_str = value.ToString();
			vector<std::string> search_paths = StringUtil::Split(search_paths_str, ',');
			for (const auto &search_path : search_paths) {
				auto joined_path = JoinPath(search_path, path);
				if (FileExists(joined_path, opener) || IsPipe(joined_path, opener)) {
					result.emplace_back(joined_path);
				}
			}
		}
	}
	return result;
}